

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O1

adt_error_t adt_str_append_cstr(adt_str_t *self,char *cstr)

{
  byte bVar1;
  long lVar2;
  adt_error_t aVar3;
  int s32NewLen;
  ulong uVar4;
  byte bVar5;
  
  if (cstr == (char *)0x0 || self == (adt_str_t *)0x0) {
    return '\x01';
  }
  bVar5 = 1;
  uVar4 = 0;
  bVar1 = *cstr;
  while (bVar1 != 0) {
    if ((bVar5 == 1) && ((char)bVar1 < '\0')) {
      bVar5 = ((bVar1 & 0xe0) == 0xc0 || ((bVar1 & 0xf0) == 0xe0 || (bVar1 & 0xf8) == 0xf0)) ^ 3;
    }
    lVar2 = uVar4 + 1;
    uVar4 = uVar4 + 1;
    bVar1 = cstr[lVar2];
  }
  if ((int)uVar4 != 0) {
    s32NewLen = self->s32Cur + (int)uVar4;
    aVar3 = adt_str_reserve(self,s32NewLen);
    if (aVar3 != '\0') {
      return aVar3;
    }
    if (self->s32Size <= s32NewLen) {
      __assert_fail("self->s32Size > newSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                    ,0x1ca,"adt_error_t adt_str_append_cstr(adt_str_t *, const char *)");
    }
    memcpy(self->pAlloc + self->s32Cur,cstr,uVar4 & 0xffffffff);
    self->s32Cur = s32NewLen;
    if (bVar5 != 2) {
      return '\0';
    }
    if (self->encoding != '\x01') {
      return '\0';
    }
    self->encoding = '\x02';
  }
  return '\0';
}

Assistant:

adt_error_t adt_str_append_cstr(adt_str_t *self, const char *cstr)
{
   adt_error_t retval = ADT_NO_ERROR;
   if ( (self == 0) || (cstr == 0) )
   {
      retval = ADT_INVALID_ARGUMENT_ERROR;
   }
   else
   {
      int32_t s32Size = 0;
      adt_str_encoding_t encoding = adt_utf8_checkEncodingAndSize((const uint8_t*) cstr, 0, &s32Size);
      if ( (encoding != ADT_STR_ENCODING_UNKNOWN) && (s32Size > 0) )
      {
         adt_error_t result;
         int32_t newSize = self->s32Cur+s32Size;
         result = adt_str_reserve(self, newSize);
         if (result == ADT_NO_ERROR)
         {
            assert(self->s32Size > newSize);
            memcpy(self->pAlloc+self->s32Cur, cstr, s32Size);
            self->s32Cur = newSize;
            if ( (self->encoding == ADT_STR_ENCODING_ASCII) && (encoding == ADT_STR_ENCODING_UTF8) )
            {
               self->encoding = encoding;
            }
         }
         else
         {
            retval = result;
         }
      }
   }
   return retval;
}